

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O3

void henson::Serialization<henson::Scheduler::Job>::save(BinaryBuffer *bb,Job *j)

{
  size_t sz;
  size_type local_20;
  
  (**bb->_vptr_BinaryBuffer)(bb,j,8);
  local_20 = (j->name)._M_string_length;
  (**bb->_vptr_BinaryBuffer)(bb,&local_20,8);
  (**bb->_vptr_BinaryBuffer)(bb,(j->name)._M_dataplus._M_p,local_20);
  local_20 = (j->function)._M_string_length;
  (**bb->_vptr_BinaryBuffer)(bb,&local_20,8);
  (**bb->_vptr_BinaryBuffer)(bb,(j->function)._M_dataplus._M_p,local_20);
  (**bb->_vptr_BinaryBuffer)(bb,&(j->arg).position,8);
  (**bb->_vptr_BinaryBuffer)
            (bb,(j->arg).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,(j->arg).position);
  Serialization<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::save(bb,&j->groups);
  (**bb->_vptr_BinaryBuffer)(bb,&j->size,8);
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Scheduler::Job& j)
    {
        henson::save(bb, j.id);
        henson::save(bb, j.name);
        henson::save(bb, j.function);
        henson::save(bb, j.arg);
        henson::save(bb, j.groups);
        henson::save(bb, j.size);
    }